

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void bench_ellswift_decode(void *arg,int iters)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  undefined8 *puVar10;
  undefined1 *puVar11;
  long lVar12;
  char **argv;
  int argc;
  undefined8 *puVar13;
  undefined8 *puVar14;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined8 *puVar20;
  size_t len;
  secp256k1_pubkey out;
  int in_stack_fffffffffffffd40;
  char **ppcStack_2b8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined1 auStack_258 [72];
  undefined8 uStack_210;
  undefined1 auStack_208 [40];
  undefined8 uStack_1e0;
  undefined1 auStack_1d8 [64];
  undefined1 auStack_198 [64];
  undefined8 uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  undefined8 *puStack_140;
  undefined8 *puStack_138;
  code *pcStack_130;
  int iStack_124;
  undefined8 *puStack_120;
  undefined8 uStack_118;
  ulong uStack_110;
  undefined8 *puStack_108;
  undefined1 *puStack_100;
  undefined8 *puStack_f8;
  undefined8 *puStack_f0;
  code *pcStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  ulong uStack_a0;
  undefined1 *puStack_98;
  undefined1 *puStack_90;
  void *pvStack_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined1 local_70 [64];
  undefined8 uVar15;
  
  if (iters < 1) {
    return;
  }
  lVar19 = (long)arg + 0x4008;
  uVar7 = 0;
  while( true ) {
    puVar13 = *arg;
    pcStack_80 = (code *)0x102e12;
    puVar11 = local_70;
    iVar3 = secp256k1_ellswift_decode(puVar13,local_70,lVar19);
    uVar9 = (uint)puVar11;
    if (iVar3 != 1) break;
    local_78 = 0x21;
    puVar13 = *arg;
    lVar12 = (ulong)((uint)uVar7 & 0x1f) + lVar19;
    pcStack_80 = (code *)0x102e3b;
    iVar3 = secp256k1_ec_pubkey_serialize(puVar13,lVar12,&local_78,local_70,0x102);
    uVar9 = (uint)lVar12;
    if (iVar3 == 0) goto LAB_00102e59;
    uVar9 = (uint)uVar7 + 1;
    uVar7 = (ulong)uVar9;
    if (iters == uVar9) {
      return;
    }
  }
  pcStack_80 = (code *)0x102e59;
  bench_ellswift_decode_cold_1();
LAB_00102e59:
  pcStack_80 = bench_ellswift_create;
  bench_ellswift_decode_cold_2();
  if ((int)uVar9 < 1) {
    return;
  }
  puVar1 = puVar13 + 0x801;
  uStack_a0 = (ulong)(uint)iters;
  puStack_98 = local_70;
  puStack_90 = (undefined1 *)&local_78;
  pvStack_88 = arg;
  pcStack_80 = (code *)lVar19;
  while( true ) {
    puVar14 = (undefined8 *)*puVar13;
    pcStack_e8 = (code *)0x102e96;
    iStack_124 = (int)&uStack_e0;
    iVar3 = secp256k1_ellswift_create(puVar14,&uStack_e0,puVar1,puVar13 + 0x805);
    if (iVar3 == 0) break;
    puVar13[0x807] = uStack_b0;
    puVar13[0x808] = uStack_a8;
    puVar13[0x805] = uStack_c0;
    puVar13[0x806] = uStack_b8;
    puVar13[0x803] = uStack_d0;
    puVar13[0x804] = uStack_c8;
    *puVar1 = uStack_e0;
    puVar13[0x802] = uStack_d8;
    uVar9 = uVar9 - 1;
    if (uVar9 == 0) {
      return;
    }
  }
  pcStack_e8 = bench_ellswift_xdh;
  bench_ellswift_create_cold_1();
  if (iStack_124 < 1) {
    return;
  }
  puVar2 = puVar14 + 0x801;
  uStack_118 = _secp256k1_ellswift_xdh_hash_function_bip324;
  puVar10 = puVar14 + 0x803;
  uVar17 = 0x10;
  uVar18 = 0;
  puVar20 = puVar2;
  puStack_120 = puVar14;
  uStack_110 = (ulong)uVar9;
  puStack_108 = puVar13 + 0x805;
  puStack_100 = (undefined1 *)&uStack_e0;
  puStack_f8 = puVar13;
  puStack_f0 = puVar1;
  pcStack_e8 = (code *)uVar7;
  while( true ) {
    argv = (char **)((long)puVar20 + (uVar18 / 0x21) * -0x21);
    uVar15 = *puStack_120;
    pcStack_130 = (code *)0x0;
    puStack_138 = (undefined8 *)uStack_118;
    puStack_140 = (undefined8 *)0x102f80;
    iVar3 = secp256k1_ellswift_xdh
                      (uVar15,argv,puVar2,puVar2,(long)puVar10 + (uVar17 / 0x21) * -0x21);
    argc = (int)uVar15;
    if (iVar3 != 1) break;
    uVar18 = uVar18 + 1;
    puVar10 = (undefined8 *)((long)puVar10 + 1);
    uVar17 = uVar17 + 1;
    puVar20 = (undefined8 *)((long)puVar20 + 1);
    if (iStack_124 == (int)uVar18) {
      return;
    }
  }
  pcStack_130 = main;
  bench_ellswift_xdh_cold_1();
  uStack_158 = 0xf83e0f83e0f83e1;
  uStack_150 = uVar17;
  uStack_148 = uVar18;
  puStack_140 = puVar2;
  puStack_138 = puVar20;
  pcStack_130 = (code *)puVar10;
  pcVar6 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar6 == (char *)0x0) {
    uVar7 = 20000;
  }
  else {
    uVar7 = strtol(pcVar6,(char **)0x0,0);
  }
  lVar19 = (long)argc;
  if (argc != 1) {
    ppcStack_2b8 = argv + 1;
    do {
      pcVar6 = *ppcStack_2b8;
      lVar12 = 0;
      while( true ) {
        pcVar16 = pcVar6;
        iVar3 = strcmp(pcVar6,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar12));
        iVar5 = (int)pcVar16;
        if (iVar3 == 0) break;
        lVar12 = lVar12 + 8;
        if (lVar12 == 0xa8) goto LAB_0010305e;
      }
      ppcStack_2b8 = ppcStack_2b8 + 1;
    } while (ppcStack_2b8 != argv + lVar19);
LAB_0010305e:
    if (1 < argc) {
      lVar12 = lVar19 * 8;
      lVar8 = 8;
      do {
        pcVar6 = *(char **)((long)argv + lVar8);
        if (((*pcVar6 == '-') && (pcVar6[1] == 'h')) && (pcVar6[2] == '\0')) goto LAB_001030e7;
        lVar8 = lVar8 + 8;
      } while (lVar12 - lVar8 != 0);
      lVar8 = 8;
      do {
        if (lVar12 - lVar8 == 0) {
          lVar8 = 8;
          goto LAB_001030ce;
        }
        pcVar6 = *(char **)((long)argv + lVar8);
        iVar4 = strcmp(pcVar6,"--help");
        iVar5 = (int)pcVar6;
        lVar8 = lVar8 + 8;
      } while (iVar4 != 0);
      goto LAB_001030e7;
    }
  }
LAB_00103103:
  lVar19 = lVar19 * 8;
  lVar12 = 8;
  do {
    if (lVar19 == lVar12) {
      lVar12 = 8;
      goto LAB_0010313c;
    }
    iVar3 = strcmp(*(char **)((long)argv + lVar12),"recover");
    lVar12 = lVar12 + 8;
  } while (iVar3 != 0);
  goto LAB_00103155;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar12),"ecdsa");
    lVar12 = lVar12 + 8;
    if (iVar5 == 0) break;
LAB_00103297:
    if (lVar19 == lVar12) {
      lVar12 = 8;
      goto LAB_001032bf;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar12),"verify");
    lVar12 = lVar12 + 8;
    if (iVar5 == 0) break;
LAB_001032bf:
    if (lVar19 == lVar12) {
      lVar12 = 8;
      goto LAB_001032e7;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar12),"sign");
    lVar12 = lVar12 + 8;
    if (iVar5 == 0) break;
LAB_00103357:
    if (lVar19 == lVar12) {
      lVar12 = 8;
      goto LAB_0010337f;
    }
  }
  goto LAB_00103398;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar12),"ecdsa_sign");
    lVar12 = lVar12 + 8;
    if (iVar5 == 0) break;
LAB_0010337f:
    if (lVar19 == lVar12) goto LAB_001033ba;
  }
  goto LAB_00103398;
  while( true ) {
    iVar4 = strcmp(*(char **)((long)argv + lVar12),"ec_keygen");
    iVar5 = (int)uVar15;
    lVar12 = lVar12 + 8;
    if (iVar4 == 0) break;
LAB_00103417:
    if (lVar19 == lVar12) goto LAB_00103458;
  }
  goto LAB_00103430;
  while( true ) {
    pcVar6 = *(char **)((long)argv + lVar8);
    iVar4 = strcmp(pcVar6,"help");
    iVar5 = (int)pcVar6;
    lVar8 = lVar8 + 8;
    if (iVar4 == 0) break;
LAB_001030ce:
    if (lVar12 - lVar8 == 0) {
      if (iVar3 != 0) {
        main_cold_1();
        return;
      }
      goto LAB_00103103;
    }
  }
LAB_001030e7:
  help(iVar5);
  return;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar12),"ecdsa_recover");
    lVar12 = lVar12 + 8;
    if (iVar3 == 0) break;
LAB_0010313c:
    if (lVar19 == lVar12) {
      uStack_2a0 = secp256k1_context_create(1);
      uStack_298 = 0x807060504030201;
      uStack_290 = 0x100f0e0d0c0b0a09;
      uStack_288 = 0x1817161514131211;
      uStack_280 = 0x201f1e1d1c1b1a19;
      uStack_278 = 0x2827262524232221;
      uStack_270 = 0x302f2e2d2c2b2a29;
      uStack_268 = 0x34333231;
      uStack_264 = 0x38373635;
      uStack_260 = 0x3c3b3a39;
      uStack_25c = 0x403f3e3d;
      uStack_210 = 0x48;
      uVar15 = 0;
      iVar3 = secp256k1_ecdsa_sign(uStack_2a0,auStack_1d8,&uStack_298,&uStack_278,0);
      if (iVar3 == 0) {
        main_cold_6();
LAB_001034ae:
        main_cold_5();
      }
      else {
        iVar3 = secp256k1_ecdsa_signature_serialize_der
                          (uStack_2a0,auStack_258,&uStack_210,auStack_1d8);
        if (iVar3 == 0) goto LAB_001034ae;
        iVar3 = secp256k1_ec_pubkey_create(uStack_2a0,auStack_198,&uStack_278);
        if (iVar3 != 0) {
          uStack_1e0 = 0x21;
          iVar3 = secp256k1_ec_pubkey_serialize
                            (uStack_2a0,auStack_208,&uStack_1e0,auStack_198,0x102);
          if (iVar3 != 1) goto LAB_001034b8;
          printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
                 "    Max(us)    ");
          putchar(10);
          iVar3 = (int)uVar7;
          if (argc == 1) goto LAB_00103300;
          lVar12 = 8;
          goto LAB_00103297;
        }
      }
      main_cold_4();
LAB_001034b8:
      main_cold_3();
      puts("Benchmarks the following algorithms:");
      puts("    - ECDSA signing/verification");
      puts("    - ECDH key exchange (optional module)");
      puts("    - Schnorr signatures (optional module)");
      puts("    - ElligatorSwift (optional module)");
      putchar(10);
      printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
      puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
      putchar(10);
      puts("Usage: ./bench [args]");
      puts("By default, all benchmarks will be run.");
      puts("args:");
      puts("    help              : display this help and exit");
      puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
      puts("    ecdsa_sign        : ECDSA siging algorithm");
      puts("    ecdsa_verify      : ECDSA verification algorithm");
      puts("    ec                : all EC public key algorithms (keygen)");
      puts("    ec_keygen         : EC public key generation");
      puts("    ecdh              : ECDH key exchange algorithm");
      puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
      puts("    schnorrsig_sign   : Schnorr sigining algorithm");
      puts("    schnorrsig_verify : Schnorr verification algorithm");
      puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
      puts("    ellswift_encode   : ElligatorSwift encoding");
      puts("    ellswift_decode   : ElligatorSwift decoding");
      puts("    ellswift_keygen   : ElligatorSwift key generation");
      puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
      putchar(10);
      return;
    }
  }
LAB_00103155:
  main_cold_2();
  return;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar12),"ecdsa_verify");
    lVar12 = lVar12 + 8;
    if (iVar5 == 0) break;
LAB_001032e7:
    if (lVar19 == lVar12) goto LAB_0010331d;
  }
LAB_00103300:
  run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)&uStack_2a0,(void *)(uVar7 & 0xffffffff),(int)uVar15,
                in_stack_fffffffffffffd40);
LAB_0010331d:
  if (argc != 1) {
    lVar12 = 8;
    do {
      if (lVar19 == lVar12) {
        lVar12 = 8;
        goto LAB_00103357;
      }
      iVar5 = strcmp(*(char **)((long)argv + lVar12),"ecdsa");
      lVar12 = lVar12 + 8;
    } while (iVar5 != 0);
  }
LAB_00103398:
  run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,(_func_void_void_ptr_int *)&uStack_2a0,
                (void *)(uVar7 & 0xffffffff),(int)uVar15,in_stack_fffffffffffffd40);
LAB_001033ba:
  iVar5 = (int)uVar15;
  if (argc != 1) {
    lVar12 = 8;
    do {
      pcVar6 = *(char **)((long)argv + lVar12);
      if (((*pcVar6 == 'e') && (pcVar6[1] == 'c')) && (pcVar6[2] == '\0')) goto LAB_00103430;
      lVar12 = lVar12 + 8;
    } while (lVar19 != lVar12);
    lVar12 = 8;
    do {
      if (lVar19 == lVar12) {
        lVar12 = 8;
        goto LAB_00103417;
      }
      iVar4 = strcmp(*(char **)((long)argv + lVar12),"keygen");
      iVar5 = (int)uVar15;
      lVar12 = lVar12 + 8;
    } while (iVar4 != 0);
  }
LAB_00103430:
  run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                (_func_void_void_ptr_int *)&uStack_2a0,(void *)(uVar7 & 0xffffffff),iVar5,
                in_stack_fffffffffffffd40);
LAB_00103458:
  secp256k1_context_destroy(uStack_2a0);
  run_ecdh_bench(iVar3,argc,argv);
  run_schnorrsig_bench(iVar3,argc,argv);
  run_ellswift_bench(iVar3,argc,argv);
  return;
}

Assistant:

static void bench_ellswift_decode(void *arg, int iters) {
    int i;
    secp256k1_pubkey out;
    size_t len;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        CHECK(secp256k1_ellswift_decode(data->ctx, &out, data->rnd64) == 1);
        len = 33;
        CHECK(secp256k1_ec_pubkey_serialize(data->ctx, data->rnd64 + (i % 32), &len, &out, SECP256K1_EC_COMPRESSED));
    }
}